

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::Event::disarm(Event *this)

{
  Event **ppEVar1;
  Event **ppEVar2;
  EventLoop *pEVar3;
  Event *pEVar4;
  long in_FS_OFFSET;
  Fault f;
  Fault local_8;
  
  ppEVar2 = this->prev;
  if (ppEVar2 != (Event **)0x0) {
    pEVar3 = this->loop;
    if (*(EventLoop **)(in_FS_OFFSET + -0x28) != (EventLoop *)0x0 &&
        *(EventLoop **)(in_FS_OFFSET + -0x28) != pEVar3) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                (&local_8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x8ff,FAILED,(char *)0x0,
                 "\"Promise destroyed from a different thread than it was created in.\"",
                 (char (*) [66])"Promise destroyed from a different thread than it was created in.")
      ;
      Debug::Fault::fatal(&local_8);
    }
    ppEVar1 = &this->next;
    if (pEVar3->tail == ppEVar1) {
      pEVar3->tail = ppEVar2;
    }
    if (pEVar3->depthFirstInsertPoint == ppEVar1) {
      pEVar3->depthFirstInsertPoint = ppEVar2;
    }
    if (pEVar3->breadthFirstInsertPoint == ppEVar1) {
      pEVar3->breadthFirstInsertPoint = ppEVar2;
    }
    if (pEVar3->wouldSleepTail == ppEVar1) {
      pEVar3->wouldSleepTail = ppEVar2;
    }
    pEVar4 = *ppEVar1;
    *ppEVar2 = pEVar4;
    if (pEVar4 != (Event *)0x0) {
      pEVar4->prev = this->prev;
    }
    *ppEVar1 = (Event *)0x0;
    this->prev = (Event **)0x0;
  }
  return;
}

Assistant:

void Event::disarm() noexcept {
  if (prev != nullptr) {
    if (threadLocalEventLoop != &loop && threadLocalEventLoop != nullptr) {
      // This will crash because the method is `noexcept`. That's good because otherwise we're
      // likely going to segfault later.
      KJ_FAIL_ASSERT("Promise destroyed from a different thread than it was created in.");
    }

    if (loop.tail == &next) {
      loop.tail = prev;
    }
    if (loop.depthFirstInsertPoint == &next) {
      loop.depthFirstInsertPoint = prev;
    }
    if (loop.breadthFirstInsertPoint == &next) {
      loop.breadthFirstInsertPoint = prev;
    }
    if (loop.wouldSleepTail == &next) {
      loop.wouldSleepTail = prev;
    }

    *prev = next;
    if (next != nullptr) {
      next->prev = prev;
    }

    prev = nullptr;
    next = nullptr;
  }
}